

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void HalfMergeUVRow_C(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,
                     uint8_t *dst_uv,int width)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)src_stride_u;
  if (1 < width) {
    lVar2 = 0;
    do {
      dst_uv[lVar2] =
           (uint8_t)((uint)src_u[lVar2 + lVar1 + 1] +
                     (uint)src_u[lVar2 + lVar1] + (uint)src_u[lVar2 + 1] + (uint)src_u[lVar2] + 2 >>
                    2);
      dst_uv[lVar2 + 1] =
           (uint8_t)((uint)src_v[lVar2 + (src_stride_v + 1)] +
                     (uint)src_v[lVar2 + src_stride_v] + (uint)src_v[lVar2 + 1] + (uint)src_v[lVar2]
                     + 2 >> 2);
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < width + -1);
    src_u = src_u + lVar2;
    dst_uv = dst_uv + lVar2;
    src_v = src_v + lVar2;
  }
  if ((width & 1U) != 0) {
    *dst_uv = (uint8_t)((uint)*src_u + (uint)src_u[lVar1] + 1 >> 1);
    dst_uv[1] = (uint8_t)((uint)src_v[src_stride_v] + (uint)*src_v + 1 >> 1);
  }
  return;
}

Assistant:

void HalfMergeUVRow_C(const uint8_t* src_u,
                      int src_stride_u,
                      const uint8_t* src_v,
                      int src_stride_v,
                      uint8_t* dst_uv,
                      int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = (src_u[0] + src_u[1] + src_u[src_stride_u] +
                 src_u[src_stride_u + 1] + 2) >>
                2;
    dst_uv[1] = (src_v[0] + src_v[1] + src_v[src_stride_v] +
                 src_v[src_stride_v + 1] + 2) >>
                2;
    src_u += 2;
    src_v += 2;
    dst_uv += 2;
  }
  if (width & 1) {
    dst_uv[0] = (src_u[0] + src_u[src_stride_u] + 1) >> 1;
    dst_uv[1] = (src_v[0] + src_v[src_stride_v] + 1) >> 1;
  }
}